

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

double __thiscall PhyloTree::getBranchLengthSum(PhyloTree *this)

{
  pointer pPVar1;
  double *pdVar2;
  PhyloTreeEdge *edge;
  pointer this_00;
  double dVar3;
  double dVar4;
  
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  for (this_00 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1)
  {
    dVar4 = PhyloTreeEdge::getLength(this_00);
    dVar3 = dVar3 + dVar4;
  }
  for (pdVar2 = (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    dVar3 = dVar3 + *pdVar2;
  }
  return dVar3;
}

Assistant:

double PhyloTree::getBranchLengthSum() {
    double sum = 0;
    for (auto &edge : edges) {
        sum += edge.getLength();
    }

    for (auto attrib : leafEdgeLengths) {
        sum += attrib;
    }

    return sum;
}